

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::ReadCostData(cmCTestMultiProcessHandler *this)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  mapped_type *ppcVar5;
  int index;
  PropertiesMap *local_2c0;
  double local_2b8;
  vector<cmsys::String,_std::allocator<cmsys::String>_> parts;
  string line;
  string fname;
  string name;
  ifstream fin;
  
  cmCTest::GetCostDataFile_abi_cxx11_(&fname,this->CTest);
  bVar2 = cmsys::SystemTools::FileExists(fname._M_dataplus._M_p,true);
  if (bVar2) {
    std::ifstream::ifstream(&fin);
    std::ifstream::open((char *)&fin,(_Ios_Openmode)fname._M_dataplus._M_p);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    local_2c0 = &this->Properties;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar2 = std::operator==(&line,"---");
      if (bVar2) break;
      cmsys::SystemTools::SplitString(&parts,&line,' ',false);
      if ((ulong)((long)parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                       _M_impl.super__Vector_impl_data._M_start) < 0x41) {
        std::ifstream::close();
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&parts);
        goto LAB_0034285e;
      }
      std::__cxx11::string::string
                ((string *)&name,
                 (string *)
                 parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pSVar1 = parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = atoi(parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                   super__Vector_impl_data._M_start[1].super_string._M_dataplus._M_p);
      local_2b8 = atof(pSVar1[2].super_string._M_dataplus._M_p);
      index = SearchByName(this,&name);
      if (index != -1) {
        ppcVar5 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&local_2c0->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&index);
        (*ppcVar5)->PreviousRuns = iVar3;
        if (1 < this->ParallelLevel) {
          ppcVar5 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&local_2c0->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&index);
          if (*ppcVar5 != (mapped_type)0x0) {
            ppcVar5 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_2c0->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&index);
            if (((*ppcVar5)->Cost == 0.0) && (!NAN((*ppcVar5)->Cost))) {
              ppcVar5 = std::
                        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                        ::operator[](&local_2c0->
                                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ,&index);
              (*ppcVar5)->Cost = (float)local_2b8;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&name);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&parts);
    }
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar2 = std::operator!=(&line,"");
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->LastTestsFailed,&line);
      }
    }
    std::ifstream::close();
LAB_0034285e:
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&fin);
  }
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::ReadCostData()
{
  std::string fname = this->CTest->GetCostDataFile();

  if (cmSystemTools::FileExists(fname.c_str(), true)) {
    cmsys::ifstream fin;
    fin.open(fname.c_str());
    std::string line;
    while (std::getline(fin, line)) {
      if (line == "---") {
        break;
      }

      std::vector<cmsys::String> parts = cmSystemTools::SplitString(line, ' ');

      // Probably an older version of the file, will be fixed next run
      if (parts.size() < 3) {
        fin.close();
        return;
      }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if (index == -1) {
        continue;
      }

      this->Properties[index]->PreviousRuns = prev;
      // When not running in parallel mode, don't use cost data
      if (this->ParallelLevel > 1 && this->Properties[index] &&
          this->Properties[index]->Cost == 0) {
        this->Properties[index]->Cost = cost;
      }
    }
    // Next part of the file is the failed tests
    while (std::getline(fin, line)) {
      if (line != "") {
        this->LastTestsFailed.push_back(line);
      }
    }
    fin.close();
  }
}